

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O2

off_t knet_seek(knetFile *fp,off_t off,int whence)

{
  int iVar1;
  FILE *__stream;
  __off_t _Var2;
  int *piVar3;
  char *pcVar4;
  
  if ((whence == 0) && (fp->offset == off)) {
    return 0;
  }
  iVar1 = fp->type;
  if (iVar1 == 3) {
    if (whence != 1) {
      if (whence == 2) {
        fwrite("[knet_seek] SEEK_END is not supported for HTTP. Offset is unchanged.\n",0x45,1,
               _stderr);
        piVar3 = __errno_location();
        *piVar3 = 0x1d;
        return -1;
      }
      if (whence != 0) {
        return -1;
      }
      goto LAB_0010f0dc;
    }
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 == 1) {
        _Var2 = lseek(fp->fd,off,whence);
        if (_Var2 != -1) {
          fp->offset = _Var2;
          return _Var2;
        }
      }
      else {
        piVar3 = __errno_location();
        *piVar3 = 0x16;
        __stream = _stderr;
        pcVar4 = strerror(0x16);
        fprintf(__stream,"[knet_seek] %s\n",pcVar4);
      }
      return -1;
    }
    if (whence != 1) {
      if (whence != 0) {
        if (whence != 2) {
          return -1;
        }
        off = off + fp->file_size;
      }
      goto LAB_0010f0dc;
    }
  }
  off = off + fp->offset;
LAB_0010f0dc:
  fp->offset = off;
  fp->is_ready = 0;
  return off;
}

Assistant:

off_t knet_seek(knetFile *fp, off_t off, int whence)
{
	if (whence == SEEK_SET && off == fp->offset) return 0;
	if (fp->type == KNF_TYPE_LOCAL) {
		/* Be aware that lseek() returns the offset after seeking, while fseek() returns zero on success. */
		off_t offset = lseek(fp->fd, off, whence);
		if (offset == -1) return -1;
		fp->offset = offset;
		return fp->offset;
	} else if (fp->type == KNF_TYPE_FTP) {
		if (whence == SEEK_CUR) fp->offset += off;
		else if (whence == SEEK_SET) fp->offset = off;
		else if (whence == SEEK_END) fp->offset = fp->file_size + off;
		else return -1;
		fp->is_ready = 0;
		return fp->offset;
	} else if (fp->type == KNF_TYPE_HTTP) {
		if (whence == SEEK_END) { // FIXME: can we allow SEEK_END in future?
			fprintf(stderr, "[knet_seek] SEEK_END is not supported for HTTP. Offset is unchanged.\n");
			errno = ESPIPE;
			return -1;
		}
		if (whence == SEEK_CUR) fp->offset += off;
		else if (whence == SEEK_SET) fp->offset = off;
		else return -1;
		fp->is_ready = 0;
		return fp->offset;
	}
	errno = EINVAL;
	fprintf(stderr,"[knet_seek] %s\n", strerror(errno));
	return -1;
}